

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O2

void __thiscall r_exec::_Mem::_Mem(_Mem *this)

{
  vector<r_code::list<core::P<r_code::Code>_>::cell,_std::allocator<r_code::list<core::P<r_code::Code>_>::cell>_>
  *pvVar1;
  ModelBase *this_00;
  
  r_code::Mem::Mem(&this->super_Mem);
  *(undefined ***)this = &PTR___cxa_pure_virtual_001d2758;
  JobQueue<r_exec::_ReductionJob>::JobQueue(&this->m_reductionJobQueue);
  JobQueue<r_exec::TimeJob>::JobQueue(&this->m_timeJobQueue);
  (this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(__pthread_internal_list **)
   ((long)&(this->m_reductionJobMutex).super___mutex_base._M_mutex + 0x18) =
       (__pthread_internal_list *)0x0;
  *(__pthread_internal_list **)
   ((long)&(this->m_reductionJobMutex).super___mutex_base._M_mutex + 0x20) =
       (__pthread_internal_list *)0x0;
  *(undefined1 (*) [16])((long)&(this->m_reductionJobMutex).super___mutex_base._M_mutex + 8) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_timeJobMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->m_timeJobMutex).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_timeJobMutex).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  (this->m_coreThreads).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::condition_variable::condition_variable(&this->m_coresRunning);
  *(undefined1 (*) [16])
   ((long)&(this->m_coreCountMutex).super___mutex_base._M_mutex.__data.__list.__prev + 4) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->m_coreCountMutex).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_coreCountMutex).super___mutex_base._M_mutex =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_stateMutex).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->m_stateMutex).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->m_stateMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (undefined1  [16])0x0;
  pvVar1 = &(this->objects).cells;
  (pvVar1->
  super__Vector_base<r_code::list<core::P<r_code::Code>_>::cell,_std::allocator<r_code::list<core::P<r_code::Code>_>::cell>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar1->
  super__Vector_base<r_code::list<core::P<r_code::Code>_>::cell,_std::allocator<r_code::list<core::P<r_code::Code>_>::cell>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->objects).free_cells = -1;
  *(undefined4 *)&(this->objects).used_cells_head = 0xffffffff;
  *(undefined4 *)((long)&(this->objects).used_cells_head + 4) = 0xffffffff;
  *(undefined4 *)&(this->objects).used_cells_tail = 0xffffffff;
  *(undefined4 *)((long)&(this->objects).used_cells_tail + 4) = 0xffffffff;
  this->metadata = (Metadata *)0x0;
  (this->_root).object = (_Object *)0x0;
  (this->objects).used_cell_count = 0;
  (this->objects).free_cell_count = 0;
  (this->initial_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->initial_groups).super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->initial_groups).
           super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->initial_groups).
           super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  this_00 = (ModelBase *)operator_new(0xa0);
  ModelBase::ModelBase(this_00);
  std::
  vector<r_code::list<core::P<r_code::Code>_>::cell,_std::allocator<r_code::list<core::P<r_code::Code>_>::cell>_>
  ::reserve(&(this->objects).cells,0x400);
  return;
}

Assistant:

_Mem::_Mem(): r_code::Mem(), state(NOT_STARTED), deleted(false)
{
    new ModelBase();
    objects.reserve(1024);
}